

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts3MatchinfoSelectDoctotal
              (Fts3Table *pTab,sqlite3_stmt **ppStmt,sqlite3_int64 *pnDoc,char **paLen)

{
  int iVar1;
  char *p;
  undefined8 *in_RCX;
  ulong *in_RDX;
  long *in_RSI;
  int rc;
  sqlite3_int64 nDoc;
  char *a;
  sqlite3_stmt *pStmt;
  int in_stack_ffffffffffffffbc;
  sqlite3_stmt *in_stack_ffffffffffffffc0;
  sqlite3_stmt **in_stack_ffffffffffffffc8;
  Fts3Table *in_stack_ffffffffffffffd0;
  int local_4;
  
  if (*in_RSI == 0) {
    iVar1 = sqlite3Fts3SelectDoctotal(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
    if (iVar1 != 0) {
      return iVar1;
    }
    in_stack_ffffffffffffffbc = 0;
  }
  p = (char *)sqlite3_column_blob(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffbc);
  iVar1 = sqlite3Fts3GetVarint(p,(sqlite_int64 *)&stack0xffffffffffffffc0);
  if (in_stack_ffffffffffffffc0 == (sqlite3_stmt *)0x0) {
    local_4 = 0x10b;
  }
  else {
    *in_RDX = (ulong)in_stack_ffffffffffffffc0 & 0xffffffff;
    if (in_RCX != (undefined8 *)0x0) {
      *in_RCX = p + iVar1;
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int fts3MatchinfoSelectDoctotal(
  Fts3Table *pTab,
  sqlite3_stmt **ppStmt,
  sqlite3_int64 *pnDoc,
  const char **paLen
){
  sqlite3_stmt *pStmt;
  const char *a;
  sqlite3_int64 nDoc;

  if( !*ppStmt ){
    int rc = sqlite3Fts3SelectDoctotal(pTab, ppStmt);
    if( rc!=SQLITE_OK ) return rc;
  }
  pStmt = *ppStmt;
  assert( sqlite3_data_count(pStmt)==1 );

  a = sqlite3_column_blob(pStmt, 0);
  a += sqlite3Fts3GetVarint(a, &nDoc);
  if( nDoc==0 ) return FTS_CORRUPT_VTAB;
  *pnDoc = (u32)nDoc;

  if( paLen ) *paLen = a;
  return SQLITE_OK;
}